

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

presentation_type fmt::v8::detail::parse_presentation_type<char>(char type)

{
  char cVar1;
  char in_DIL;
  presentation_type local_1;
  
  cVar1 = to_ascii<char,_0>(in_DIL);
  switch(cVar1) {
  case 'A':
    local_1 = hexfloat_upper;
    break;
  case 'B':
    local_1 = bin_upper;
    break;
  default:
    local_1 = none;
    break;
  case 'E':
    local_1 = exp_upper;
    break;
  case 'F':
    local_1 = fixed_upper;
    break;
  case 'G':
    local_1 = general_upper;
    break;
  case 'X':
    local_1 = hex_upper;
    break;
  case 'a':
    local_1 = hexfloat_lower;
    break;
  case 'b':
    local_1 = bin_lower;
    break;
  case 'c':
    local_1 = chr;
    break;
  case 'd':
    local_1 = dec;
    break;
  case 'e':
    local_1 = exp_lower;
    break;
  case 'f':
    local_1 = fixed_lower;
    break;
  case 'g':
    local_1 = general_lower;
    break;
  case 'o':
    local_1 = oct;
    break;
  case 'p':
    local_1 = pointer;
    break;
  case 's':
    local_1 = string;
    break;
  case 'x':
    local_1 = hex_lower;
  }
  return local_1;
}

Assistant:

FMT_CONSTEXPR auto parse_presentation_type(Char type) -> presentation_type {
  switch (to_ascii(type)) {
  case 'd':
    return presentation_type::dec;
  case 'o':
    return presentation_type::oct;
  case 'x':
    return presentation_type::hex_lower;
  case 'X':
    return presentation_type::hex_upper;
  case 'b':
    return presentation_type::bin_lower;
  case 'B':
    return presentation_type::bin_upper;
  case 'a':
    return presentation_type::hexfloat_lower;
  case 'A':
    return presentation_type::hexfloat_upper;
  case 'e':
    return presentation_type::exp_lower;
  case 'E':
    return presentation_type::exp_upper;
  case 'f':
    return presentation_type::fixed_lower;
  case 'F':
    return presentation_type::fixed_upper;
  case 'g':
    return presentation_type::general_lower;
  case 'G':
    return presentation_type::general_upper;
  case 'c':
    return presentation_type::chr;
  case 's':
    return presentation_type::string;
  case 'p':
    return presentation_type::pointer;
  default:
    return presentation_type::none;
  }
}